

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_div_s_d_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  ulong uVar1;
  float64 fVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0x8000000000000000;
  uVar1 = (env->active_fpu).fpr[ws].fd;
  fVar2 = (env->active_fpu).fpr[wt].fd;
  uVar4 = 0x8000000000000000;
  if (fVar2 != 0xffffffffffffffff || uVar1 != 0x8000000000000000) {
    if (fVar2 == 0) {
      uVar4 = (long)~uVar1 >> 0x3f | 1;
    }
    else {
      uVar4 = (long)uVar1 / (long)fVar2;
    }
  }
  (env->active_fpu).fpr[wd].fd = uVar4;
  uVar1 = *(ulong *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  lVar3 = *(long *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  if (lVar3 != -1 || uVar1 != 0x8000000000000000) {
    if (lVar3 == 0) {
      uVar5 = (long)~uVar1 >> 0x3f | 1;
    }
    else {
      uVar5 = (long)uVar1 / lVar3;
    }
  }
  *(ulong *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar5;
  return;
}

Assistant:

void helper_msa_div_s_d(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->d[0]  = msa_div_s_df(DF_DOUBLE, pws->d[0],  pwt->d[0]);
    pwd->d[1]  = msa_div_s_df(DF_DOUBLE, pws->d[1],  pwt->d[1]);
}